

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O3

hugeint_t duckdb::Hugeint::Multiply<true>(hugeint_t lhs,hugeint_t rhs)

{
  bool bVar1;
  OutOfRangeException *this;
  int64_t in_RCX;
  uint64_t in_RDX;
  int64_t in_RSI;
  uint64_t in_RDI;
  hugeint_t lhs_00;
  hugeint_t rhs_00;
  hugeint_t result;
  hugeint_t local_b0;
  hugeint_t local_a0;
  hugeint_t local_90;
  string local_80;
  string local_60;
  string local_40;
  
  lhs_00.upper = in_RSI;
  lhs_00.lower = in_RDI;
  rhs_00.upper = in_RCX;
  rhs_00.lower = in_RDX;
  bVar1 = TryMultiply(lhs_00,rhs_00,&local_90);
  if (bVar1) {
    return local_90;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Overflow in HUGEINT multiplication: %s + %s","");
  hugeint_t::ToString_abi_cxx11_(&local_40,&local_a0);
  hugeint_t::ToString_abi_cxx11_(&local_60,&local_b0);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_80,&local_40,&local_60);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline static hugeint_t Multiply(hugeint_t lhs, hugeint_t rhs) {
		hugeint_t result;
		if (!TryMultiply(lhs, rhs, result)) {
			throw OutOfRangeException("Overflow in HUGEINT multiplication: %s + %s", lhs.ToString(), rhs.ToString());
		}
		return result;
	}